

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_gme.cpp
# Opt level: O0

int __thiscall GMESong::CalcSongLength(GMESong *this)

{
  GMESong *this_local;
  
  if (this->TrackInfo == (gme_info_t *)0x0) {
    this_local._4_4_ = 150000;
  }
  else if (this->TrackInfo->length < 1) {
    if (this->TrackInfo->loop_length < 1) {
      this_local._4_4_ = 150000;
    }
    else {
      this_local._4_4_ = this->TrackInfo->intro_length + this->TrackInfo->loop_length * 2;
    }
  }
  else {
    this_local._4_4_ = this->TrackInfo->length;
  }
  return this_local._4_4_;
}

Assistant:

int GMESong::CalcSongLength()
{
	if (TrackInfo == NULL)
	{
		return 150000;
	}
	if (TrackInfo->length > 0)
	{
		return TrackInfo->length;
	}
	if (TrackInfo->loop_length > 0)
	{
		return TrackInfo->intro_length + TrackInfo->loop_length * 2;
	}
	return 150000;
}